

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O1

double eval_guided_crit<float,long_double>
                 (size_t *ix_arr,size_t st,size_t end,float *x,double *buffer_sd,
                 bool as_relative_gain,double *buffer_imputed_x,double *saved_xmedian,
                 size_t *split_ix,double *split_point,double *xmin,double *xmax,
                 GainCriterion criterion,double min_gain,MissingAction missing_action,
                 size_t *cols_use,size_t ncols_use,bool force_cols_use,double *X_row_major,
                 size_t ncols,double *Xr,size_t *Xr_ind,size_t *Xr_indptr)

{
  uint uVar1;
  unsigned_long *__first;
  float fVar2;
  float fVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  unsigned_long *__last;
  undefined7 in_register_00000089;
  size_t st_non_na;
  size_t st_00;
  double dVar7;
  undefined8 in_XMM0_Qb;
  undefined4 uVar8;
  undefined4 uVar9;
  double dVar10;
  allocator_type local_81;
  float local_80;
  undefined4 local_7c;
  undefined1 local_78 [16];
  float *x_local;
  vector<double,_std::allocator<double>_> temp_buffer;
  
  uVar8 = 0;
  uVar9 = 0;
  dVar7 = 0.0;
  if (1 < criterion - FullGain) {
    uVar8 = (undefined4)in_XMM0_Qb;
    uVar9 = (undefined4)((ulong)in_XMM0_Qb >> 0x20);
    dVar7 = min_gain;
  }
  uVar6 = st;
  st_00 = st;
  if (st <= end && missing_action != Fail) {
    do {
      if (0x7f7fffff < (uint)ABS(x[ix_arr[uVar6]])) {
        sVar4 = ix_arr[st_00];
        ix_arr[st_00] = ix_arr[uVar6];
        ix_arr[uVar6] = sVar4;
        st_00 = st_00 + 1;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 <= end);
  }
  dVar10 = -INFINITY;
  if (st_00 < end) {
    local_78._8_4_ = uVar8;
    local_78._0_8_ = dVar7;
    local_78._12_4_ = uVar9;
    __first = ix_arr + st_00;
    x_local = x;
    if (st_00 == end - 1) {
      fVar2 = x[*__first];
      fVar3 = x[ix_arr[end]];
      if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
        dVar7 = midpoint_with_reorder<float>(fVar2,fVar3);
        *split_point = dVar7;
        *split_ix = st_00;
        dVar10 = (double)(-(ulong)((double)local_78._0_8_ < 1.0) & 0x3ff0000000000000);
      }
    }
    else {
      local_7c = (undefined4)CONCAT71(in_register_00000089,as_relative_gain);
      __last = ix_arr + end + 1;
      if (__first != __last) {
        uVar6 = (long)__last - (long)__first >> 3;
        lVar5 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        std::
        __introsort_loop<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<eval_guided_crit<float,long_double>(unsigned_long*,unsigned_long,unsigned_long,float*,double*,bool,double*,double*,unsigned_long&,double&,double&,double&,GainCriterion,double,MissingAction,unsigned_long*,unsigned_long,bool,double*,unsigned_long,double*,unsigned_long*,unsigned_long*)::_lambda(unsigned_long,unsigned_long)_1_>>
                  (__first,__last,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_david_cortes[P]isotree_src_crit_hpp:3225:46)>
                    )&x_local);
        std::
        __final_insertion_sort<unsigned_long*,__gnu_cxx::__ops::_Iter_comp_iter<eval_guided_crit<float,long_double>(unsigned_long*,unsigned_long,unsigned_long,float*,double*,bool,double*,double*,unsigned_long&,double&,double&,double&,GainCriterion,double,MissingAction,unsigned_long*,unsigned_long,bool,double*,unsigned_long,double*,unsigned_long*,unsigned_long*)::_lambda(unsigned_long,unsigned_long)_1_>>
                  (__first,__last,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_david_cortes[P]isotree_src_crit_hpp:3225:46)>
                    )&x_local);
      }
      fVar2 = x_local[*__first];
      fVar3 = x_local[ix_arr[end]];
      if ((fVar2 != fVar3) || (dVar10 = -INFINITY, NAN(fVar2) || NAN(fVar3))) {
        *xmin = (double)fVar2;
        *xmax = (double)fVar3;
        uVar1 = criterion - Averaged;
        local_80 = 0.0;
        uVar6 = st_00;
        if (uVar1 < 2) {
          for (; uVar6 <= end; uVar6 = uVar6 + 1) {
            local_80 = local_80 + x_local[ix_arr[uVar6]];
          }
          local_80 = local_80 / (float)((end - st_00) + 1);
        }
        if (st < st_00 && missing_action == Impute) {
          fill_NAs_with_median<float>(ix_arr,st,st_00,end,x_local,buffer_imputed_x,saved_xmedian);
          if (((criterion != Pooled) || (0.0 < (double)local_78._0_8_)) || ((char)local_7c == '\0'))
          {
            if (uVar1 < 2) {
              dVar10 = find_split_std_gain<double,long_double>
                                 (buffer_imputed_x,(double)local_80,ix_arr,st,end,buffer_sd,
                                  criterion,(double)local_78._0_8_,split_point,split_ix);
            }
            else if (criterion == DensityCrit) {
              dVar10 = find_split_dens<double,long_double>
                                 (buffer_imputed_x,ix_arr,st,end,split_point,split_ix);
            }
            else {
              dVar10 = 0.0;
              if (criterion == FullGain) {
                std::vector<double,_std::allocator<double>_>::vector
                          (&temp_buffer,ncols * 2,&local_81);
                dVar7 = find_split_full_gain<double,long_double>
                                  (buffer_imputed_x,st,end,ix_arr,cols_use,ncols_use,force_cols_use,
                                   X_row_major,ncols,Xr,Xr_ind,Xr_indptr,
                                   temp_buffer.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start,
                                   temp_buffer.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start + ncols,split_ix,
                                   split_point,true);
                local_78._0_8_ = dVar7;
                eval_guided_crit<float,long_double>();
                dVar10 = (double)local_78._0_8_;
              }
            }
          }
          else {
            dVar10 = find_split_rel_gain<double,long_double>
                               (buffer_imputed_x,(double)local_80,ix_arr,st,end,split_point,split_ix
                               );
          }
        }
        else if (((criterion != Pooled) || (0.0 < (double)local_78._0_8_)) ||
                ((char)local_7c == '\0')) {
          if (uVar1 < 2) {
            dVar10 = find_split_std_gain<float,long_double>
                               (x_local,local_80,ix_arr,st_00,end,buffer_sd,criterion,
                                (double)local_78._0_8_,split_point,split_ix);
          }
          else if (criterion == DensityCrit) {
            dVar10 = find_split_dens<float,long_double>
                               (x_local,ix_arr,st_00,end,split_point,split_ix);
          }
          else {
            dVar10 = 0.0;
            if (criterion == FullGain) {
              local_78._0_8_ = st_00;
              std::vector<double,_std::allocator<double>_>::vector(&temp_buffer,ncols * 2,&local_81)
              ;
              local_78._0_8_ =
                   find_split_full_gain<float,long_double>
                             (x_local,local_78._0_8_,end,ix_arr,cols_use,ncols_use,force_cols_use,
                              X_row_major,ncols,Xr,Xr_ind,Xr_indptr,
                              temp_buffer.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              temp_buffer.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start + ncols,split_ix,split_point,
                              true);
              eval_guided_crit<float,long_double>();
              dVar10 = (double)local_78._0_8_;
            }
          }
        }
        else {
          dVar10 = find_split_rel_gain<float,long_double>
                             (x_local,local_80,ix_arr,st_00,end,split_point,split_ix);
        }
        if (dVar10 <= 0.0) {
          dVar10 = 0.0;
        }
      }
    }
  }
  return dVar10;
}

Assistant:

double eval_guided_crit(size_t *restrict ix_arr, size_t st, size_t end, real_t_ *restrict x,
                        double *restrict buffer_sd, bool as_relative_gain,
                        double *restrict buffer_imputed_x, double *restrict saved_xmedian,
                        size_t &split_ix, double &restrict split_point, double &restrict xmin, double &restrict xmax,
                        GainCriterion criterion, double min_gain, MissingAction missing_action,
                        size_t *restrict cols_use, size_t ncols_use, bool force_cols_use,
                        double *restrict X_row_major, size_t ncols,
                        double *restrict Xr, size_t *restrict Xr_ind, size_t *restrict Xr_indptr)
{
    size_t st_orig = st;
    double gain = 0;
    if (criterion == DensityCrit || criterion == FullGain) min_gain = 0;

    /* move NAs to the front if there's any, exclude them from calculations */
    if (missing_action != Fail)
        st = move_NAs_to_front(ix_arr, st, end, x);

    if (unlikely(st >= end)) return -HUGE_VAL;
    else if (unlikely(st == (end-1)))
    {
        if (x[ix_arr[st]] == x[ix_arr[end]])
            return -HUGE_VAL;
        split_point = midpoint_with_reorder(x[ix_arr[st]], x[ix_arr[end]]);
        split_ix    = st;
        gain        = 1.;
        if (gain > min_gain)
            return gain;
        else
            return 0.;
    }

    /* sort in ascending order */
    std::sort(ix_arr + st, ix_arr + end + 1, [&x](const size_t a, const size_t b){return x[a] < x[b];});
    if (x[ix_arr[st]] == x[ix_arr[end]]) return -HUGE_VAL;
    xmin = x[ix_arr[st]]; xmax = x[ix_arr[end]];

    /* unlike the previous case for the extended model, the data here has not been centered,
       which could make the standard deviations have poor precision. It's nevertheless not
       necessary for this mean to have good precision, since it's only meant for centering,
       so it can be calculated inexactly with simd instructions. */
    real_t_ xmean = 0;
    if (criterion == Pooled || criterion == Averaged)
    {
        for (size_t ix = st; ix <= end; ix++)
            xmean += x[ix_arr[ix]];
        xmean /= (real_t_)(end - st + 1);
    }

    if (missing_action == Impute && st > st_orig)
    {
        missing_action = Fail;
        fill_NAs_with_median(ix_arr, st_orig, st, end, x, buffer_imputed_x, saved_xmedian);
        if (criterion == Pooled && as_relative_gain && min_gain <= 0)
            gain = find_split_rel_gain<double, ldouble_safe>(buffer_imputed_x, (double)xmean, ix_arr, st_orig, end, split_point, split_ix);
        else if (criterion == Pooled || criterion == Averaged)
            gain = find_split_std_gain<double, ldouble_safe>(buffer_imputed_x, (double)xmean, ix_arr, st_orig, end, buffer_sd, criterion, min_gain, split_point, split_ix);
        else if (criterion == DensityCrit)
            gain = find_split_dens<double, ldouble_safe>(buffer_imputed_x, ix_arr, st_orig, end, split_point, split_ix);
        else if (criterion == FullGain)
        {
            /* TODO: this buffer should be allocated from outside */
            std::vector<double> temp_buffer(mult2(ncols));
            gain = find_split_full_gain<double, ldouble_safe>(
                                        buffer_imputed_x, st_orig, end, ix_arr,
                                        cols_use, ncols_use, force_cols_use,
                                        X_row_major, ncols,
                                        Xr, Xr_ind, Xr_indptr,
                                        temp_buffer.data(), temp_buffer.data() + ncols,
                                        split_ix, split_point, true);
        }

        /* Note: in theory, it should be possible to use a faster version assuming a contiguous array for 'x',
           but such an approach might give inexact split points. Better to avoid such inexactness at the
           expense of more computations. */
    }

    else
    {
        if (criterion == Pooled && as_relative_gain && min_gain <= 0)
            gain = find_split_rel_gain<real_t_, ldouble_safe>(x, xmean, ix_arr, st, end, split_point, split_ix);
        else if (criterion == Pooled || criterion == Averaged)
            gain = find_split_std_gain<real_t_, ldouble_safe>(x, xmean, ix_arr, st, end, buffer_sd, criterion, min_gain, split_point, split_ix);
        else if (criterion == DensityCrit)
            gain = find_split_dens<real_t_, ldouble_safe>(x, ix_arr, st, end, split_point, split_ix);
        else if (criterion == FullGain)
        {
            /* TODO: this buffer should be allocated from outside */
            std::vector<double> temp_buffer(mult2(ncols));
            gain = find_split_full_gain<real_t_, ldouble_safe>(
                                        x, st, end, ix_arr,
                                        cols_use, ncols_use, force_cols_use,
                                        X_row_major, ncols,
                                        Xr, Xr_ind, Xr_indptr,
                                        temp_buffer.data(), temp_buffer.data() + ncols,
                                        split_ix, split_point, true);
        }
    }

    /* Note: a gain of -Inf signals that the data is unsplittable. Zero signals it's below the minimum. */
    return std::fmax(0., gain);
}